

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O0

bool __thiscall tcu::CommandLine::parse(CommandLine *this,string *cmdLine)

{
  bool bVar1;
  char *commandLine;
  deCommandLine *cmdLine_00;
  bad_alloc *this_00;
  bool isOk;
  deCommandLine *parsedCmdLine;
  string *cmdLine_local;
  CommandLine *this_local;
  
  commandLine = (char *)std::__cxx11::string::c_str();
  cmdLine_00 = deCommandLine_parse(commandLine);
  if (cmdLine_00 == (deCommandLine *)0x0) {
    this_00 = (bad_alloc *)__cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(this_00);
    __cxa_throw(this_00,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  bVar1 = parse(this,cmdLine_00->numArgs,cmdLine_00->args);
  deCommandLine_destroy(cmdLine_00);
  return bVar1;
}

Assistant:

bool CommandLine::parse (const std::string& cmdLine)
{
	deCommandLine* parsedCmdLine = deCommandLine_parse(cmdLine.c_str());
	if (!parsedCmdLine)
		throw std::bad_alloc();

	bool isOk = false;
	try
	{
		isOk = parse(parsedCmdLine->numArgs, parsedCmdLine->args);
	}
	catch (...)
	{
		deCommandLine_destroy(parsedCmdLine);
		throw;
	}

	deCommandLine_destroy(parsedCmdLine);
	return isOk;
}